

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_header_gen.c
# Opt level: O0

MPP_RET h265e_set_extra_info(H265eCtx *ctx)

{
  H265eExtraInfo *out;
  H265eSps *sps_00;
  H265eVps *vps_00;
  H265eVps *vps;
  H265ePps *pps;
  H265eSps *sps;
  H265eExtraInfo *info;
  H265eCtx *ctx_local;
  
  out = (H265eExtraInfo *)ctx->extra_info;
  sps_00 = &ctx->sps;
  vps_00 = &ctx->vps;
  if ((h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_header_gen","enter\n","h265e_set_extra_info");
  }
  out->nal_num = 0;
  out->temporal_id = 0;
  h265e_stream_reset(&out->stream);
  h265e_nal_start(out,0x20,3);
  h265e_set_vps(ctx,vps_00);
  h265e_vps_write(vps_00,&out->stream);
  h265e_nal_end(out);
  h265e_nal_start(out,0x21,3);
  h265e_set_sps(ctx,sps_00,vps_00);
  h265e_sps_write(sps_00,&out->stream);
  h265e_nal_end(out);
  h265e_nal_start(out,0x22,3);
  h265e_set_pps(ctx,&ctx->pps,sps_00);
  h265e_pps_write(&ctx->pps,sps_00,&out->stream);
  h265e_nal_end(out);
  h265e_encapsulate_nals(out);
  if ((h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_header_gen","leave\n","h265e_set_extra_info");
  }
  return MPP_OK;
}

Assistant:

MPP_RET h265e_set_extra_info(H265eCtx *ctx)
{
    H265eExtraInfo *info = (H265eExtraInfo *)ctx->extra_info;
    H265eSps *sps = &ctx->sps;
    H265ePps *pps = &ctx->pps;
    H265eVps *vps = &ctx->vps;

    h265e_dbg_func("enter\n");
    info->nal_num = 0;
    info->temporal_id = 0;
    h265e_stream_reset(&info->stream);

    h265e_nal_start(info, NAL_VPS, H265_NAL_PRIORITY_HIGHEST);
    h265e_set_vps(ctx, vps);
    h265e_vps_write(vps, &info->stream);
    h265e_nal_end(info);

    h265e_nal_start(info, NAL_SPS, H265_NAL_PRIORITY_HIGHEST);
    h265e_set_sps(ctx, sps, vps);
    h265e_sps_write(sps, &info->stream);
    h265e_nal_end(info);

    h265e_nal_start(info, NAL_PPS, H265_NAL_PRIORITY_HIGHEST);
    h265e_set_pps(ctx, pps, sps);
    h265e_pps_write(pps, sps, &info->stream);
    h265e_nal_end(info);

    h265e_encapsulate_nals(info);

    h265e_dbg_func("leave\n");
    return MPP_OK;
}